

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::copyValueFrom
          (TypedAttribute<Imath_2_5::Matrix44<float>_> *this,Attribute *other)

{
  TypedAttribute<Imath_2_5::Matrix44<float>_> *pTVar1;
  
  pTVar1 = cast(other);
  (this->_value).x[0][0] = (pTVar1->_value).x[0][0];
  (this->_value).x[0][1] = (pTVar1->_value).x[0][1];
  (this->_value).x[0][2] = (pTVar1->_value).x[0][2];
  (this->_value).x[0][3] = (pTVar1->_value).x[0][3];
  (this->_value).x[1][0] = (pTVar1->_value).x[1][0];
  (this->_value).x[1][1] = (pTVar1->_value).x[1][1];
  (this->_value).x[1][2] = (pTVar1->_value).x[1][2];
  (this->_value).x[1][3] = (pTVar1->_value).x[1][3];
  (this->_value).x[2][0] = (pTVar1->_value).x[2][0];
  (this->_value).x[2][1] = (pTVar1->_value).x[2][1];
  (this->_value).x[2][2] = (pTVar1->_value).x[2][2];
  (this->_value).x[2][3] = (pTVar1->_value).x[2][3];
  (this->_value).x[3][0] = (pTVar1->_value).x[3][0];
  (this->_value).x[3][1] = (pTVar1->_value).x[3][1];
  (this->_value).x[3][2] = (pTVar1->_value).x[3][2];
  (this->_value).x[3][3] = (pTVar1->_value).x[3][3];
  return;
}

Assistant:

void		
TypedAttribute<T>::copyValueFrom (const Attribute &other)
{
    _value = cast(other)._value;
}